

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O2

uint32_t blockmix_salsa8_xor(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r)

{
  salsa20_blk_t *psVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  int iVar21;
  __m128i Y1;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar22;
  uint uVar33;
  uint uVar34;
  __m128i Y3;
  undefined1 auVar23 [16];
  uint uVar35;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i Y2;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i Y0;
  undefined1 auVar47 [16];
  uint uVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar61;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar62;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i Y0_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar111;
  int iVar112;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar113;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint uVar114;
  uint uVar142;
  uint uVar143;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar144;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar145;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  uint uVar146;
  uint uVar147;
  uint uVar165;
  int iVar166;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar167;
  int iVar168;
  uint uVar169;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar170 [16];
  
  lVar9 = r - 1;
  lVar7 = lVar9 * 0x80;
  lVar6 = lVar9 * 2;
  psVar1 = Bin1 + lVar9 * 2 + 1;
  do {
    bVar10 = lVar9 != 0;
    lVar9 = lVar9 + -1;
  } while (bVar10);
  uVar147 = Bin2[lVar6 + 1].w[0] ^ psVar1->w[0];
  uVar165 = *(uint *)((long)Bin2 + lVar7 + 0x44) ^ psVar1->w[1];
  uVar167 = *(uint *)((long)Bin2 + lVar7 + 0x48) ^ psVar1->w[2];
  uVar169 = *(uint *)((long)Bin2 + lVar7 + 0x4c) ^ psVar1->w[3];
  uVar22 = *(uint *)((long)Bin2 + lVar7 + 0x50) ^ psVar1->w[4];
  uVar33 = *(uint *)((long)Bin2 + lVar7 + 0x54) ^ psVar1->w[5];
  uVar34 = *(uint *)((long)Bin2 + lVar7 + 0x58) ^ psVar1->w[6];
  uVar35 = *(uint *)((long)Bin2 + lVar7 + 0x5c) ^ psVar1->w[7];
  auVar36 = *(undefined1 (*) [16])((long)Bin2 + lVar7 + 0x60) ^ (undefined1  [16])psVar1->q[2];
  auVar23 = *(undefined1 (*) [16])((long)Bin2 + lVar7 + 0x70) ^ (undefined1  [16])psVar1->q[3];
  lVar9 = 0x30;
  sVar8 = r;
  while (bVar10 = sVar8 != 0, sVar8 = sVar8 - 1, bVar10) {
    puVar2 = (uint *)((long)Bin1 + lVar9 * 2 + -0x60);
    puVar3 = (uint *)((long)Bin1 + lVar9 * 2 + -0x50);
    puVar4 = (uint *)((long)Bin2 + lVar9 * 2 + -0x60);
    puVar5 = (uint *)((long)Bin2 + lVar9 * 2 + -0x50);
    uVar22 = uVar22 ^ *puVar3 ^ *puVar5;
    uVar33 = uVar33 ^ puVar3[1] ^ puVar5[1];
    uVar34 = uVar34 ^ puVar3[2] ^ puVar5[2];
    uVar35 = uVar35 ^ puVar3[3] ^ puVar5[3];
    auVar36 = auVar36 ^ *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2 + -0x40) ^
              *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2 + -0x40);
    uVar147 = *puVar2 ^ *puVar4 ^ uVar147;
    uVar165 = puVar2[1] ^ puVar4[1] ^ uVar165;
    uVar167 = puVar2[2] ^ puVar4[2] ^ uVar167;
    uVar169 = puVar2[3] ^ puVar4[3] ^ uVar169;
    auVar23 = auVar23 ^ *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2 + -0x30) ^
              *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2 + -0x30);
    uVar62 = auVar23._0_4_ + uVar147;
    uVar74 = auVar23._4_4_ + uVar165;
    uVar75 = auVar23._8_4_ + uVar167;
    uVar76 = auVar23._12_4_ + uVar169;
    uVar114 = (uVar62 * 0x80 | uVar62 >> 0x19) ^ uVar22;
    uVar142 = (uVar74 * 0x80 | uVar74 >> 0x19) ^ uVar33;
    uVar143 = (uVar75 * 0x80 | uVar75 >> 0x19) ^ uVar34;
    uVar144 = (uVar76 * 0x80 | uVar76 >> 0x19) ^ uVar35;
    auVar48._0_4_ = uVar114 + uVar147 >> 0x17;
    auVar48._4_4_ = uVar142 + uVar165 >> 0x17;
    auVar48._8_4_ = uVar143 + uVar167 >> 0x17;
    auVar48._12_4_ = uVar144 + uVar169 >> 0x17;
    auVar77._0_4_ = (uVar114 + uVar147) * 0x200;
    auVar77._4_4_ = (uVar142 + uVar165) * 0x200;
    auVar77._8_4_ = (uVar143 + uVar167) * 0x200;
    auVar77._12_4_ = (uVar144 + uVar169) * 0x200;
    auVar78 = (auVar77 | auVar48) ^ auVar36;
    iVar11 = auVar78._0_4_;
    iVar21 = auVar78._4_4_;
    uVar62 = auVar78._8_4_ + uVar143;
    uVar74 = auVar78._12_4_ + uVar144;
    auVar88._0_4_ = iVar11 + uVar114 >> 0x13;
    auVar88._4_4_ = iVar21 + uVar142 >> 0x13;
    auVar88._8_4_ = uVar62 >> 0x13;
    auVar88._12_4_ = uVar74 >> 0x13;
    auVar49._0_4_ = (iVar11 + uVar114) * 0x2000;
    auVar49._4_4_ = (iVar21 + uVar142) * 0x2000;
    auVar49._8_4_ = uVar62 * 0x2000;
    auVar49._12_4_ = uVar74 * 0x2000;
    auVar50 = (auVar49 | auVar88) ^ auVar23;
    auVar89._0_12_ = auVar50._4_12_;
    auVar89._12_4_ = auVar50._0_4_;
    uVar62 = auVar50._0_4_ + iVar11;
    uVar75 = auVar50._4_4_ + iVar21;
    uVar60 = auVar50._8_4_ + auVar78._8_4_;
    uVar61 = auVar50._12_4_ + auVar78._12_4_;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar147;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar165;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar167;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar169;
    auVar65._4_4_ = uVar114;
    auVar65._0_4_ = uVar144;
    auVar65._8_4_ = uVar142;
    auVar65._12_4_ = uVar143;
    auVar63._0_8_ = auVar78._8_8_;
    auVar63._8_4_ = iVar11;
    auVar63._12_4_ = iVar21;
    auVar148._0_4_ = (uVar144 + uVar74) * 0x80;
    auVar148._4_4_ = (uVar114 + uVar76) * 0x80;
    auVar148._8_4_ = (uVar142 + uVar145) * 0x80;
    auVar148._12_4_ = (uVar143 + uVar146) * 0x80;
    auVar79._0_4_ = uVar144 + uVar74 >> 0x19;
    auVar79._4_4_ = uVar114 + uVar76 >> 0x19;
    auVar79._8_4_ = uVar142 + uVar145 >> 0x19;
    auVar79._12_4_ = uVar143 + uVar146 >> 0x19;
    auVar79 = auVar79 ^ auVar148 ^ auVar89;
    iVar87 = auVar79._0_4_;
    iVar111 = auVar79._4_4_;
    iVar112 = auVar79._8_4_;
    iVar113 = auVar79._12_4_;
    auVar149._0_4_ = (iVar87 + uVar74) * 0x200;
    auVar149._4_4_ = (iVar111 + uVar76) * 0x200;
    auVar149._8_4_ = (iVar112 + uVar145) * 0x200;
    auVar149._12_4_ = (iVar113 + uVar146) * 0x200;
    auVar90._0_4_ = iVar87 + uVar74 >> 0x17;
    auVar90._4_4_ = iVar111 + uVar76 >> 0x17;
    auVar90._8_4_ = iVar112 + uVar145 >> 0x17;
    auVar90._12_4_ = iVar113 + uVar146 >> 0x17;
    auVar90 = auVar90 ^ auVar149 ^ auVar63;
    iVar11 = auVar90._0_4_;
    iVar21 = auVar90._4_4_;
    uVar62 = auVar90._8_4_ + iVar112;
    uVar75 = auVar90._12_4_ + iVar113;
    auVar150._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar150._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar150._8_4_ = uVar62 >> 0x13;
    auVar150._12_4_ = uVar75 >> 0x13;
    auVar64._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar64._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar64._8_4_ = uVar62 * 0x2000;
    auVar64._12_4_ = uVar75 * 0x2000;
    auVar65 = (auVar64 | auVar150) ^ auVar65;
    auVar115._0_12_ = auVar65._4_12_;
    auVar115._12_4_ = auVar65._0_4_;
    uVar62 = auVar65._0_4_ + iVar11;
    uVar75 = auVar65._4_4_ + iVar21;
    uVar60 = auVar65._8_4_ + auVar90._8_4_;
    uVar61 = auVar65._12_4_ + auVar90._12_4_;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146;
    auVar51._0_8_ = auVar90._8_8_;
    auVar51._8_4_ = iVar11;
    auVar51._12_4_ = iVar21;
    auVar53._4_4_ = iVar87;
    auVar53._0_4_ = iVar113;
    auVar53._8_4_ = iVar111;
    auVar53._12_4_ = iVar112;
    auVar151._0_4_ = (iVar113 + uVar74) * 0x80;
    auVar151._4_4_ = (iVar87 + uVar76) * 0x80;
    auVar151._8_4_ = (iVar111 + uVar145) * 0x80;
    auVar151._12_4_ = (iVar112 + uVar146) * 0x80;
    auVar80._0_4_ = iVar113 + uVar74 >> 0x19;
    auVar80._4_4_ = iVar87 + uVar76 >> 0x19;
    auVar80._8_4_ = iVar111 + uVar145 >> 0x19;
    auVar80._12_4_ = iVar112 + uVar146 >> 0x19;
    auVar80 = auVar80 ^ auVar151 ^ auVar115;
    iVar87 = auVar80._0_4_;
    iVar111 = auVar80._4_4_;
    iVar112 = auVar80._8_4_;
    iVar113 = auVar80._12_4_;
    auVar152._0_4_ = (iVar87 + uVar74) * 0x200;
    auVar152._4_4_ = (iVar111 + uVar76) * 0x200;
    auVar152._8_4_ = (iVar112 + uVar145) * 0x200;
    auVar152._12_4_ = (iVar113 + uVar146) * 0x200;
    auVar116._0_4_ = iVar87 + uVar74 >> 0x17;
    auVar116._4_4_ = iVar111 + uVar76 >> 0x17;
    auVar116._8_4_ = iVar112 + uVar145 >> 0x17;
    auVar116._12_4_ = iVar113 + uVar146 >> 0x17;
    auVar116 = auVar116 ^ auVar152 ^ auVar51;
    iVar11 = auVar116._0_4_;
    iVar21 = auVar116._4_4_;
    uVar62 = auVar116._8_4_ + iVar112;
    uVar75 = auVar116._12_4_ + iVar113;
    auVar153._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar153._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar153._8_4_ = uVar62 >> 0x13;
    auVar153._12_4_ = uVar75 >> 0x13;
    auVar52._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar52._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar52._8_4_ = uVar62 * 0x2000;
    auVar52._12_4_ = uVar75 * 0x2000;
    auVar53 = (auVar52 | auVar153) ^ auVar53;
    auVar91._0_12_ = auVar53._4_12_;
    auVar91._12_4_ = auVar53._0_4_;
    uVar62 = auVar53._0_4_ + iVar11;
    uVar75 = auVar53._4_4_ + iVar21;
    uVar60 = auVar53._8_4_ + auVar116._8_4_;
    uVar61 = auVar53._12_4_ + auVar116._12_4_;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146;
    auVar68._4_4_ = iVar87;
    auVar68._0_4_ = iVar113;
    auVar68._8_4_ = iVar111;
    auVar68._12_4_ = iVar112;
    auVar66._0_8_ = auVar116._8_8_;
    auVar66._8_4_ = iVar11;
    auVar66._12_4_ = iVar21;
    auVar117._0_4_ = (iVar113 + uVar74) * 0x80;
    auVar117._4_4_ = (iVar87 + uVar76) * 0x80;
    auVar117._8_4_ = (iVar111 + uVar145) * 0x80;
    auVar117._12_4_ = (iVar112 + uVar146) * 0x80;
    auVar81._0_4_ = iVar113 + uVar74 >> 0x19;
    auVar81._4_4_ = iVar87 + uVar76 >> 0x19;
    auVar81._8_4_ = iVar111 + uVar145 >> 0x19;
    auVar81._12_4_ = iVar112 + uVar146 >> 0x19;
    auVar81 = auVar81 ^ auVar117 ^ auVar91;
    iVar87 = auVar81._0_4_;
    iVar111 = auVar81._4_4_;
    iVar112 = auVar81._8_4_;
    iVar113 = auVar81._12_4_;
    auVar118._0_4_ = (iVar87 + uVar74) * 0x200;
    auVar118._4_4_ = (iVar111 + uVar76) * 0x200;
    auVar118._8_4_ = (iVar112 + uVar145) * 0x200;
    auVar118._12_4_ = (iVar113 + uVar146) * 0x200;
    auVar92._0_4_ = iVar87 + uVar74 >> 0x17;
    auVar92._4_4_ = iVar111 + uVar76 >> 0x17;
    auVar92._8_4_ = iVar112 + uVar145 >> 0x17;
    auVar92._12_4_ = iVar113 + uVar146 >> 0x17;
    auVar92 = auVar92 ^ auVar118 ^ auVar66;
    iVar11 = auVar92._0_4_;
    iVar21 = auVar92._4_4_;
    uVar62 = auVar92._8_4_ + iVar112;
    uVar75 = auVar92._12_4_ + iVar113;
    auVar119._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar119._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar119._8_4_ = uVar62 >> 0x13;
    auVar119._12_4_ = uVar75 >> 0x13;
    auVar67._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar67._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar67._8_4_ = uVar62 * 0x2000;
    auVar67._12_4_ = uVar75 * 0x2000;
    auVar68 = (auVar67 | auVar119) ^ auVar68;
    auVar120._0_12_ = auVar68._4_12_;
    auVar120._12_4_ = auVar68._0_4_;
    uVar62 = auVar68._0_4_ + iVar11;
    uVar75 = auVar68._4_4_ + iVar21;
    uVar60 = auVar68._8_4_ + auVar92._8_4_;
    uVar61 = auVar68._12_4_ + auVar92._12_4_;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146;
    auVar93._0_8_ = auVar92._8_8_;
    auVar93._8_4_ = iVar11;
    auVar93._12_4_ = iVar21;
    auVar85._4_4_ = iVar87;
    auVar85._0_4_ = iVar113;
    auVar85._8_4_ = iVar111;
    auVar85._12_4_ = iVar112;
    auVar82._0_4_ = (iVar113 + uVar74) * 0x80;
    auVar82._4_4_ = (iVar87 + uVar76) * 0x80;
    auVar82._8_4_ = (iVar111 + uVar145) * 0x80;
    auVar82._12_4_ = (iVar112 + uVar146) * 0x80;
    auVar54._0_4_ = iVar113 + uVar74 >> 0x19;
    auVar54._4_4_ = iVar87 + uVar76 >> 0x19;
    auVar54._8_4_ = iVar111 + uVar145 >> 0x19;
    auVar54._12_4_ = iVar112 + uVar146 >> 0x19;
    auVar54 = auVar54 ^ auVar82 ^ auVar120;
    iVar87 = auVar54._0_4_;
    iVar111 = auVar54._4_4_;
    iVar112 = auVar54._8_4_;
    iVar113 = auVar54._12_4_;
    auVar83._0_4_ = (iVar87 + uVar74) * 0x200;
    auVar83._4_4_ = (iVar111 + uVar76) * 0x200;
    auVar83._8_4_ = (iVar112 + uVar145) * 0x200;
    auVar83._12_4_ = (iVar113 + uVar146) * 0x200;
    auVar121._0_4_ = iVar87 + uVar74 >> 0x17;
    auVar121._4_4_ = iVar111 + uVar76 >> 0x17;
    auVar121._8_4_ = iVar112 + uVar145 >> 0x17;
    auVar121._12_4_ = iVar113 + uVar146 >> 0x17;
    auVar121 = auVar121 ^ auVar83 ^ auVar93;
    iVar11 = auVar121._0_4_;
    iVar21 = auVar121._4_4_;
    uVar62 = auVar121._8_4_ + iVar112;
    uVar75 = auVar121._12_4_ + iVar113;
    auVar94._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar94._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar94._8_4_ = uVar62 >> 0x13;
    auVar94._12_4_ = uVar75 >> 0x13;
    auVar84._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar84._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar84._8_4_ = uVar62 * 0x2000;
    auVar84._12_4_ = uVar75 * 0x2000;
    auVar85 = (auVar84 | auVar94) ^ auVar85;
    auVar95._0_12_ = auVar85._4_12_;
    auVar95._12_4_ = auVar85._0_4_;
    uVar62 = auVar85._0_4_ + iVar11;
    uVar75 = auVar85._4_4_ + iVar21;
    uVar60 = auVar85._8_4_ + auVar121._8_4_;
    uVar61 = auVar85._12_4_ + auVar121._12_4_;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146;
    auVar57._4_4_ = iVar87;
    auVar57._0_4_ = iVar113;
    auVar57._8_4_ = iVar111;
    auVar57._12_4_ = iVar112;
    auVar55._0_8_ = auVar121._8_8_;
    auVar55._8_4_ = iVar11;
    auVar55._12_4_ = iVar21;
    auVar122._0_4_ = (iVar113 + uVar74) * 0x80;
    auVar122._4_4_ = (iVar87 + uVar76) * 0x80;
    auVar122._8_4_ = (iVar111 + uVar145) * 0x80;
    auVar122._12_4_ = (iVar112 + uVar146) * 0x80;
    auVar69._0_4_ = iVar113 + uVar74 >> 0x19;
    auVar69._4_4_ = iVar87 + uVar76 >> 0x19;
    auVar69._8_4_ = iVar111 + uVar145 >> 0x19;
    auVar69._12_4_ = iVar112 + uVar146 >> 0x19;
    auVar69 = auVar69 ^ auVar122 ^ auVar95;
    iVar87 = auVar69._0_4_;
    iVar111 = auVar69._4_4_;
    iVar112 = auVar69._8_4_;
    iVar113 = auVar69._12_4_;
    auVar123._0_4_ = (iVar87 + uVar74) * 0x200;
    auVar123._4_4_ = (iVar111 + uVar76) * 0x200;
    auVar123._8_4_ = (iVar112 + uVar145) * 0x200;
    auVar123._12_4_ = (iVar113 + uVar146) * 0x200;
    auVar96._0_4_ = iVar87 + uVar74 >> 0x17;
    auVar96._4_4_ = iVar111 + uVar76 >> 0x17;
    auVar96._8_4_ = iVar112 + uVar145 >> 0x17;
    auVar96._12_4_ = iVar113 + uVar146 >> 0x17;
    auVar96 = auVar96 ^ auVar123 ^ auVar55;
    iVar11 = auVar96._0_4_;
    iVar21 = auVar96._4_4_;
    uVar62 = auVar96._8_4_ + iVar112;
    uVar75 = auVar96._12_4_ + iVar113;
    auVar124._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar124._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar124._8_4_ = uVar62 >> 0x13;
    auVar124._12_4_ = uVar75 >> 0x13;
    auVar56._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar56._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar56._8_4_ = uVar62 * 0x2000;
    auVar56._12_4_ = uVar75 * 0x2000;
    auVar57 = (auVar56 | auVar124) ^ auVar57;
    auVar125._0_12_ = auVar57._4_12_;
    auVar125._12_4_ = auVar57._0_4_;
    uVar62 = auVar57._0_4_ + iVar11;
    uVar75 = auVar57._4_4_ + iVar21;
    uVar60 = auVar57._8_4_ + auVar96._8_4_;
    uVar61 = auVar57._12_4_ + auVar96._12_4_;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146;
    auVar97._0_8_ = auVar96._8_8_;
    auVar97._8_4_ = iVar11;
    auVar97._12_4_ = iVar21;
    auVar73._4_4_ = iVar87;
    auVar73._0_4_ = iVar113;
    auVar73._8_4_ = iVar111;
    auVar73._12_4_ = iVar112;
    auVar70._0_4_ = (iVar113 + uVar74) * 0x80;
    auVar70._4_4_ = (iVar87 + uVar76) * 0x80;
    auVar70._8_4_ = (iVar111 + uVar145) * 0x80;
    auVar70._12_4_ = (iVar112 + uVar146) * 0x80;
    auVar86._0_4_ = iVar113 + uVar74 >> 0x19;
    auVar86._4_4_ = iVar87 + uVar76 >> 0x19;
    auVar86._8_4_ = iVar111 + uVar145 >> 0x19;
    auVar86._12_4_ = iVar112 + uVar146 >> 0x19;
    auVar86 = auVar86 ^ auVar70 ^ auVar125;
    uVar114 = auVar86._0_4_;
    uVar142 = auVar86._4_4_;
    uVar143 = auVar86._8_4_;
    uVar144 = auVar86._12_4_;
    auVar71._0_4_ = (uVar114 + uVar74) * 0x200;
    auVar71._4_4_ = (uVar142 + uVar76) * 0x200;
    auVar71._8_4_ = (uVar143 + uVar145) * 0x200;
    auVar71._12_4_ = (uVar144 + uVar146) * 0x200;
    auVar126._0_4_ = uVar114 + uVar74 >> 0x17;
    auVar126._4_4_ = uVar142 + uVar76 >> 0x17;
    auVar126._8_4_ = uVar143 + uVar145 >> 0x17;
    auVar126._12_4_ = uVar144 + uVar146 >> 0x17;
    auVar126 = auVar126 ^ auVar71 ^ auVar97;
    iVar11 = auVar126._0_4_;
    iVar21 = auVar126._4_4_;
    uVar62 = auVar126._8_4_ + uVar143;
    uVar75 = auVar126._12_4_ + uVar144;
    auVar98._0_4_ = iVar11 + uVar114 >> 0x13;
    auVar98._4_4_ = iVar21 + uVar142 >> 0x13;
    auVar98._8_4_ = uVar62 >> 0x13;
    auVar98._12_4_ = uVar75 >> 0x13;
    auVar72._0_4_ = (iVar11 + uVar114) * 0x2000;
    auVar72._4_4_ = (iVar21 + uVar142) * 0x2000;
    auVar72._8_4_ = uVar62 * 0x2000;
    auVar72._12_4_ = uVar75 * 0x2000;
    auVar73 = (auVar72 | auVar98) ^ auVar73;
    auVar99._0_12_ = auVar73._4_12_;
    auVar99._12_4_ = auVar73._0_4_;
    uVar62 = auVar73._0_4_ + iVar11;
    uVar75 = auVar73._4_4_ + iVar21;
    uVar60 = auVar73._8_4_ + auVar126._8_4_;
    uVar61 = auVar73._12_4_ + auVar126._12_4_;
    auVar127._0_8_ = auVar126._8_8_;
    auVar127._8_4_ = iVar11;
    auVar127._12_4_ = iVar21;
    uVar74 = (uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74;
    uVar76 = (uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76;
    uVar145 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145;
    uVar146 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146;
    auVar154._0_4_ = (uVar144 + uVar74) * 0x80;
    auVar154._4_4_ = (uVar114 + uVar76) * 0x80;
    auVar154._8_4_ = (uVar142 + uVar145) * 0x80;
    auVar154._12_4_ = (uVar143 + uVar146) * 0x80;
    auVar58._0_4_ = uVar144 + uVar74 >> 0x19;
    auVar58._4_4_ = uVar114 + uVar76 >> 0x19;
    auVar58._8_4_ = uVar142 + uVar145 >> 0x19;
    auVar58._12_4_ = uVar143 + uVar146 >> 0x19;
    auVar58 = auVar58 ^ auVar154 ^ auVar99;
    iVar11 = auVar58._0_4_;
    iVar21 = auVar58._4_4_;
    iVar87 = auVar58._8_4_;
    iVar111 = auVar58._12_4_;
    auVar155._0_4_ = (iVar11 + uVar74) * 0x200;
    auVar155._4_4_ = (iVar21 + uVar76) * 0x200;
    auVar155._8_4_ = (iVar87 + uVar145) * 0x200;
    auVar155._12_4_ = (iVar111 + uVar146) * 0x200;
    auVar100._0_4_ = iVar11 + uVar74 >> 0x17;
    auVar100._4_4_ = iVar21 + uVar76 >> 0x17;
    auVar100._8_4_ = iVar87 + uVar145 >> 0x17;
    auVar100._12_4_ = iVar111 + uVar146 >> 0x17;
    auVar100 = auVar100 ^ auVar155 ^ auVar127;
    iVar112 = auVar100._0_4_;
    iVar113 = auVar100._4_4_;
    iVar166 = auVar100._8_4_;
    iVar168 = auVar100._12_4_;
    uVar144 = ((iVar112 + iVar11) * 0x2000 | (uint)(iVar112 + iVar11) >> 0x13) ^ uVar144;
    uVar114 = ((iVar113 + iVar21) * 0x2000 | (uint)(iVar113 + iVar21) >> 0x13) ^ uVar114;
    uVar142 = ((iVar166 + iVar87) * 0x2000 | (uint)(iVar166 + iVar87) >> 0x13) ^ uVar142;
    uVar143 = ((iVar168 + iVar111) * 0x2000 | (uint)(iVar168 + iVar111) >> 0x13) ^ uVar143;
    uVar62 = uVar144 + iVar112;
    uVar75 = uVar114 + iVar113;
    uVar60 = uVar142 + iVar166;
    uVar61 = uVar143 + iVar168;
    uVar147 = ((uVar62 * 0x40000 | uVar62 >> 0xe) ^ uVar74) + uVar147;
    uVar165 = ((uVar75 * 0x40000 | uVar75 >> 0xe) ^ uVar76) + uVar165;
    uVar167 = ((uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar145) + uVar167;
    uVar169 = ((uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar146) + uVar169;
    puVar2 = (uint *)((long)Bout + lVar9 + -0x30);
    *puVar2 = uVar147;
    puVar2[1] = uVar165;
    puVar2[2] = uVar167;
    puVar2[3] = uVar169;
    uVar114 = uVar114 + uVar22;
    uVar142 = uVar142 + uVar33;
    uVar143 = uVar143 + uVar34;
    uVar144 = uVar144 + uVar35;
    puVar2 = (uint *)((long)Bout + lVar9 + -0x20);
    *puVar2 = uVar114;
    puVar2[1] = uVar142;
    puVar2[2] = uVar143;
    puVar2[3] = uVar144;
    auVar47._0_4_ = iVar166 + auVar36._0_4_;
    auVar47._4_4_ = iVar168 + auVar36._4_4_;
    auVar47._8_4_ = iVar112 + auVar36._8_4_;
    auVar47._12_4_ = iVar113 + auVar36._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9 + -0x10) = auVar47;
    auVar59._0_4_ = iVar111 + auVar23._0_4_;
    auVar59._4_4_ = iVar11 + auVar23._4_4_;
    auVar59._8_4_ = iVar21 + auVar23._8_4_;
    auVar59._12_4_ = iVar87 + auVar23._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9) = auVar59;
    puVar2 = (uint *)((long)Bin2 + lVar9 * 2 + -0x20);
    puVar3 = (uint *)((long)Bin2 + lVar9 * 2 + -0x10);
    puVar4 = (uint *)((long)Bin1 + lVar9 * 2 + -0x20);
    uVar147 = *puVar2 ^ *puVar4 ^ uVar147;
    uVar165 = puVar2[1] ^ puVar4[1] ^ uVar165;
    uVar167 = puVar2[2] ^ puVar4[2] ^ uVar167;
    uVar169 = puVar2[3] ^ puVar4[3] ^ uVar169;
    puVar2 = (uint *)((long)Bin1 + lVar9 * 2 + -0x10);
    auVar59 = *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2 + 0x10) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2 + 0x10) ^ auVar59;
    uVar22 = auVar59._0_4_ + uVar147;
    uVar33 = auVar59._4_4_ + uVar165;
    uVar34 = auVar59._8_4_ + uVar167;
    uVar35 = auVar59._12_4_ + uVar169;
    uVar114 = *puVar3 ^ *puVar2 ^ uVar114;
    uVar142 = puVar3[1] ^ puVar2[1] ^ uVar142;
    uVar143 = puVar3[2] ^ puVar2[2] ^ uVar143;
    uVar144 = puVar3[3] ^ puVar2[3] ^ uVar144;
    uVar60 = (uVar22 * 0x80 | uVar22 >> 0x19) ^ uVar114;
    uVar145 = (uVar33 * 0x80 | uVar33 >> 0x19) ^ uVar142;
    uVar61 = (uVar34 * 0x80 | uVar34 >> 0x19) ^ uVar143;
    uVar146 = (uVar35 * 0x80 | uVar35 >> 0x19) ^ uVar144;
    auVar50._0_4_ = uVar60 + uVar147 >> 0x17;
    auVar50._4_4_ = uVar145 + uVar165 >> 0x17;
    auVar50._8_4_ = uVar61 + uVar167 >> 0x17;
    auVar50._12_4_ = uVar146 + uVar169 >> 0x17;
    auVar37._0_4_ = (uVar60 + uVar147) * 0x200;
    auVar37._4_4_ = (uVar145 + uVar165) * 0x200;
    auVar37._8_4_ = (uVar61 + uVar167) * 0x200;
    auVar37._12_4_ = (uVar146 + uVar169) * 0x200;
    auVar47 = *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2) ^ auVar47;
    auVar36 = (auVar37 | auVar50) ^ auVar47;
    iVar11 = auVar36._0_4_;
    iVar21 = auVar36._4_4_;
    uVar22 = auVar36._8_4_ + uVar61;
    uVar33 = auVar36._12_4_ + uVar146;
    auVar101._0_4_ = iVar11 + uVar60 >> 0x13;
    auVar101._4_4_ = iVar21 + uVar145 >> 0x13;
    auVar101._8_4_ = uVar22 >> 0x13;
    auVar101._12_4_ = uVar33 >> 0x13;
    auVar78._0_4_ = (iVar11 + uVar60) * 0x2000;
    auVar78._4_4_ = (iVar21 + uVar145) * 0x2000;
    auVar78._8_4_ = uVar22 * 0x2000;
    auVar78._12_4_ = uVar33 * 0x2000;
    auVar23 = (auVar78 | auVar101) ^ auVar59;
    auVar102._0_12_ = auVar23._4_12_;
    auVar102._12_4_ = auVar23._0_4_;
    uVar22 = auVar23._0_4_ + iVar11;
    uVar33 = auVar23._4_4_ + iVar21;
    uVar34 = auVar23._8_4_ + auVar36._8_4_;
    uVar35 = auVar23._12_4_ + auVar36._12_4_;
    uVar62 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar147;
    uVar74 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar165;
    uVar75 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar167;
    uVar76 = (uVar35 * 0x40000 | uVar35 >> 0xe) ^ uVar169;
    auVar26._4_4_ = uVar60;
    auVar26._0_4_ = uVar146;
    auVar26._8_4_ = uVar145;
    auVar26._12_4_ = uVar61;
    auVar24._0_8_ = auVar36._8_8_;
    auVar24._8_4_ = iVar11;
    auVar24._12_4_ = iVar21;
    auVar156._0_4_ = (uVar146 + uVar62) * 0x80;
    auVar156._4_4_ = (uVar60 + uVar74) * 0x80;
    auVar156._8_4_ = (uVar145 + uVar75) * 0x80;
    auVar156._12_4_ = (uVar61 + uVar76) * 0x80;
    auVar38._0_4_ = uVar146 + uVar62 >> 0x19;
    auVar38._4_4_ = uVar60 + uVar74 >> 0x19;
    auVar38._8_4_ = uVar145 + uVar75 >> 0x19;
    auVar38._12_4_ = uVar61 + uVar76 >> 0x19;
    auVar38 = auVar38 ^ auVar156 ^ auVar102;
    iVar87 = auVar38._0_4_;
    iVar111 = auVar38._4_4_;
    iVar112 = auVar38._8_4_;
    iVar113 = auVar38._12_4_;
    auVar157._0_4_ = (iVar87 + uVar62) * 0x200;
    auVar157._4_4_ = (iVar111 + uVar74) * 0x200;
    auVar157._8_4_ = (iVar112 + uVar75) * 0x200;
    auVar157._12_4_ = (iVar113 + uVar76) * 0x200;
    auVar103._0_4_ = iVar87 + uVar62 >> 0x17;
    auVar103._4_4_ = iVar111 + uVar74 >> 0x17;
    auVar103._8_4_ = iVar112 + uVar75 >> 0x17;
    auVar103._12_4_ = iVar113 + uVar76 >> 0x17;
    auVar103 = auVar103 ^ auVar157 ^ auVar24;
    iVar11 = auVar103._0_4_;
    iVar21 = auVar103._4_4_;
    uVar22 = auVar103._8_4_ + iVar112;
    uVar33 = auVar103._12_4_ + iVar113;
    auVar158._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar158._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar158._8_4_ = uVar22 >> 0x13;
    auVar158._12_4_ = uVar33 >> 0x13;
    auVar25._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar25._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar25._8_4_ = uVar22 * 0x2000;
    auVar25._12_4_ = uVar33 * 0x2000;
    auVar26 = (auVar25 | auVar158) ^ auVar26;
    auVar128._0_12_ = auVar26._4_12_;
    auVar128._12_4_ = auVar26._0_4_;
    uVar22 = auVar26._0_4_ + iVar11;
    uVar33 = auVar26._4_4_ + iVar21;
    uVar34 = auVar26._8_4_ + auVar103._8_4_;
    uVar35 = auVar26._12_4_ + auVar103._12_4_;
    uVar62 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar62;
    uVar74 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar74;
    uVar75 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar75;
    uVar76 = (uVar35 * 0x40000 | uVar35 >> 0xe) ^ uVar76;
    auVar12._0_8_ = auVar103._8_8_;
    auVar12._8_4_ = iVar11;
    auVar12._12_4_ = iVar21;
    auVar14._4_4_ = iVar87;
    auVar14._0_4_ = iVar113;
    auVar14._8_4_ = iVar111;
    auVar14._12_4_ = iVar112;
    auVar159._0_4_ = (iVar113 + uVar62) * 0x80;
    auVar159._4_4_ = (iVar87 + uVar74) * 0x80;
    auVar159._8_4_ = (iVar111 + uVar75) * 0x80;
    auVar159._12_4_ = (iVar112 + uVar76) * 0x80;
    auVar39._0_4_ = iVar113 + uVar62 >> 0x19;
    auVar39._4_4_ = iVar87 + uVar74 >> 0x19;
    auVar39._8_4_ = iVar111 + uVar75 >> 0x19;
    auVar39._12_4_ = iVar112 + uVar76 >> 0x19;
    auVar39 = auVar39 ^ auVar159 ^ auVar128;
    iVar87 = auVar39._0_4_;
    iVar111 = auVar39._4_4_;
    iVar112 = auVar39._8_4_;
    iVar113 = auVar39._12_4_;
    auVar160._0_4_ = (iVar87 + uVar62) * 0x200;
    auVar160._4_4_ = (iVar111 + uVar74) * 0x200;
    auVar160._8_4_ = (iVar112 + uVar75) * 0x200;
    auVar160._12_4_ = (iVar113 + uVar76) * 0x200;
    auVar129._0_4_ = iVar87 + uVar62 >> 0x17;
    auVar129._4_4_ = iVar111 + uVar74 >> 0x17;
    auVar129._8_4_ = iVar112 + uVar75 >> 0x17;
    auVar129._12_4_ = iVar113 + uVar76 >> 0x17;
    auVar129 = auVar129 ^ auVar160 ^ auVar12;
    iVar11 = auVar129._0_4_;
    iVar21 = auVar129._4_4_;
    uVar22 = auVar129._8_4_ + iVar112;
    uVar33 = auVar129._12_4_ + iVar113;
    auVar161._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar161._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar161._8_4_ = uVar22 >> 0x13;
    auVar161._12_4_ = uVar33 >> 0x13;
    auVar13._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar13._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar13._8_4_ = uVar22 * 0x2000;
    auVar13._12_4_ = uVar33 * 0x2000;
    auVar14 = (auVar13 | auVar161) ^ auVar14;
    auVar104._0_12_ = auVar14._4_12_;
    auVar104._12_4_ = auVar14._0_4_;
    uVar22 = auVar14._0_4_ + iVar11;
    uVar33 = auVar14._4_4_ + iVar21;
    uVar34 = auVar14._8_4_ + auVar129._8_4_;
    uVar35 = auVar14._12_4_ + auVar129._12_4_;
    uVar62 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar62;
    uVar74 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar74;
    uVar75 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar75;
    uVar76 = (uVar35 * 0x40000 | uVar35 >> 0xe) ^ uVar76;
    auVar29._4_4_ = iVar87;
    auVar29._0_4_ = iVar113;
    auVar29._8_4_ = iVar111;
    auVar29._12_4_ = iVar112;
    auVar27._0_8_ = auVar129._8_8_;
    auVar27._8_4_ = iVar11;
    auVar27._12_4_ = iVar21;
    auVar130._0_4_ = (iVar113 + uVar62) * 0x80;
    auVar130._4_4_ = (iVar87 + uVar74) * 0x80;
    auVar130._8_4_ = (iVar111 + uVar75) * 0x80;
    auVar130._12_4_ = (iVar112 + uVar76) * 0x80;
    auVar40._0_4_ = iVar113 + uVar62 >> 0x19;
    auVar40._4_4_ = iVar87 + uVar74 >> 0x19;
    auVar40._8_4_ = iVar111 + uVar75 >> 0x19;
    auVar40._12_4_ = iVar112 + uVar76 >> 0x19;
    auVar40 = auVar40 ^ auVar130 ^ auVar104;
    iVar87 = auVar40._0_4_;
    iVar111 = auVar40._4_4_;
    iVar112 = auVar40._8_4_;
    iVar113 = auVar40._12_4_;
    auVar131._0_4_ = (iVar87 + uVar62) * 0x200;
    auVar131._4_4_ = (iVar111 + uVar74) * 0x200;
    auVar131._8_4_ = (iVar112 + uVar75) * 0x200;
    auVar131._12_4_ = (iVar113 + uVar76) * 0x200;
    auVar105._0_4_ = iVar87 + uVar62 >> 0x17;
    auVar105._4_4_ = iVar111 + uVar74 >> 0x17;
    auVar105._8_4_ = iVar112 + uVar75 >> 0x17;
    auVar105._12_4_ = iVar113 + uVar76 >> 0x17;
    auVar105 = auVar105 ^ auVar131 ^ auVar27;
    iVar11 = auVar105._0_4_;
    iVar21 = auVar105._4_4_;
    uVar22 = auVar105._8_4_ + iVar112;
    uVar33 = auVar105._12_4_ + iVar113;
    auVar132._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar132._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar132._8_4_ = uVar22 >> 0x13;
    auVar132._12_4_ = uVar33 >> 0x13;
    auVar28._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar28._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar28._8_4_ = uVar22 * 0x2000;
    auVar28._12_4_ = uVar33 * 0x2000;
    auVar29 = (auVar28 | auVar132) ^ auVar29;
    auVar133._0_12_ = auVar29._4_12_;
    auVar133._12_4_ = auVar29._0_4_;
    uVar22 = auVar29._0_4_ + iVar11;
    uVar33 = auVar29._4_4_ + iVar21;
    uVar34 = auVar29._8_4_ + auVar105._8_4_;
    uVar35 = auVar29._12_4_ + auVar105._12_4_;
    uVar62 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar62;
    uVar74 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar74;
    uVar75 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar75;
    uVar76 = (uVar35 * 0x40000 | uVar35 >> 0xe) ^ uVar76;
    auVar106._0_8_ = auVar105._8_8_;
    auVar106._8_4_ = iVar11;
    auVar106._12_4_ = iVar21;
    auVar44._4_4_ = iVar87;
    auVar44._0_4_ = iVar113;
    auVar44._8_4_ = iVar111;
    auVar44._12_4_ = iVar112;
    auVar41._0_4_ = (iVar113 + uVar62) * 0x80;
    auVar41._4_4_ = (iVar87 + uVar74) * 0x80;
    auVar41._8_4_ = (iVar111 + uVar75) * 0x80;
    auVar41._12_4_ = (iVar112 + uVar76) * 0x80;
    auVar15._0_4_ = iVar113 + uVar62 >> 0x19;
    auVar15._4_4_ = iVar87 + uVar74 >> 0x19;
    auVar15._8_4_ = iVar111 + uVar75 >> 0x19;
    auVar15._12_4_ = iVar112 + uVar76 >> 0x19;
    auVar15 = auVar15 ^ auVar41 ^ auVar133;
    iVar87 = auVar15._0_4_;
    iVar111 = auVar15._4_4_;
    iVar112 = auVar15._8_4_;
    iVar113 = auVar15._12_4_;
    auVar42._0_4_ = (iVar87 + uVar62) * 0x200;
    auVar42._4_4_ = (iVar111 + uVar74) * 0x200;
    auVar42._8_4_ = (iVar112 + uVar75) * 0x200;
    auVar42._12_4_ = (iVar113 + uVar76) * 0x200;
    auVar134._0_4_ = iVar87 + uVar62 >> 0x17;
    auVar134._4_4_ = iVar111 + uVar74 >> 0x17;
    auVar134._8_4_ = iVar112 + uVar75 >> 0x17;
    auVar134._12_4_ = iVar113 + uVar76 >> 0x17;
    auVar134 = auVar134 ^ auVar42 ^ auVar106;
    iVar11 = auVar134._0_4_;
    iVar21 = auVar134._4_4_;
    uVar22 = auVar134._8_4_ + iVar112;
    uVar33 = auVar134._12_4_ + iVar113;
    auVar107._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar107._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar107._8_4_ = uVar22 >> 0x13;
    auVar107._12_4_ = uVar33 >> 0x13;
    auVar43._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar43._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar43._8_4_ = uVar22 * 0x2000;
    auVar43._12_4_ = uVar33 * 0x2000;
    auVar44 = (auVar43 | auVar107) ^ auVar44;
    auVar108._0_12_ = auVar44._4_12_;
    auVar108._12_4_ = auVar44._0_4_;
    uVar22 = auVar44._0_4_ + iVar11;
    uVar33 = auVar44._4_4_ + iVar21;
    uVar34 = auVar44._8_4_ + auVar134._8_4_;
    uVar35 = auVar44._12_4_ + auVar134._12_4_;
    uVar62 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar62;
    uVar74 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar74;
    uVar75 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar75;
    uVar76 = (uVar35 * 0x40000 | uVar35 >> 0xe) ^ uVar76;
    auVar18._4_4_ = iVar87;
    auVar18._0_4_ = iVar113;
    auVar18._8_4_ = iVar111;
    auVar18._12_4_ = iVar112;
    auVar16._0_8_ = auVar134._8_8_;
    auVar16._8_4_ = iVar11;
    auVar16._12_4_ = iVar21;
    auVar135._0_4_ = (iVar113 + uVar62) * 0x80;
    auVar135._4_4_ = (iVar87 + uVar74) * 0x80;
    auVar135._8_4_ = (iVar111 + uVar75) * 0x80;
    auVar135._12_4_ = (iVar112 + uVar76) * 0x80;
    auVar30._0_4_ = iVar113 + uVar62 >> 0x19;
    auVar30._4_4_ = iVar87 + uVar74 >> 0x19;
    auVar30._8_4_ = iVar111 + uVar75 >> 0x19;
    auVar30._12_4_ = iVar112 + uVar76 >> 0x19;
    auVar30 = auVar30 ^ auVar135 ^ auVar108;
    iVar87 = auVar30._0_4_;
    iVar111 = auVar30._4_4_;
    iVar112 = auVar30._8_4_;
    iVar113 = auVar30._12_4_;
    auVar136._0_4_ = (iVar87 + uVar62) * 0x200;
    auVar136._4_4_ = (iVar111 + uVar74) * 0x200;
    auVar136._8_4_ = (iVar112 + uVar75) * 0x200;
    auVar136._12_4_ = (iVar113 + uVar76) * 0x200;
    auVar109._0_4_ = iVar87 + uVar62 >> 0x17;
    auVar109._4_4_ = iVar111 + uVar74 >> 0x17;
    auVar109._8_4_ = iVar112 + uVar75 >> 0x17;
    auVar109._12_4_ = iVar113 + uVar76 >> 0x17;
    auVar109 = auVar109 ^ auVar136 ^ auVar16;
    iVar11 = auVar109._0_4_;
    iVar21 = auVar109._4_4_;
    uVar22 = auVar109._8_4_ + iVar112;
    uVar33 = auVar109._12_4_ + iVar113;
    auVar137._0_4_ = (uint)(iVar11 + iVar87) >> 0x13;
    auVar137._4_4_ = (uint)(iVar21 + iVar111) >> 0x13;
    auVar137._8_4_ = uVar22 >> 0x13;
    auVar137._12_4_ = uVar33 >> 0x13;
    auVar17._0_4_ = (iVar11 + iVar87) * 0x2000;
    auVar17._4_4_ = (iVar21 + iVar111) * 0x2000;
    auVar17._8_4_ = uVar22 * 0x2000;
    auVar17._12_4_ = uVar33 * 0x2000;
    auVar18 = (auVar17 | auVar137) ^ auVar18;
    auVar138._0_12_ = auVar18._4_12_;
    auVar138._12_4_ = auVar18._0_4_;
    uVar22 = auVar18._0_4_ + iVar11;
    uVar33 = auVar18._4_4_ + iVar21;
    uVar34 = auVar18._8_4_ + auVar109._8_4_;
    uVar35 = auVar18._12_4_ + auVar109._12_4_;
    uVar62 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar62;
    uVar74 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar74;
    uVar75 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar75;
    uVar76 = (uVar35 * 0x40000 | uVar35 >> 0xe) ^ uVar76;
    auVar45._0_8_ = auVar109._8_8_;
    auVar45._8_4_ = iVar11;
    auVar45._12_4_ = iVar21;
    auVar141._4_4_ = iVar87;
    auVar141._0_4_ = iVar113;
    auVar141._8_4_ = iVar111;
    auVar141._12_4_ = iVar112;
    auVar162._0_4_ = (iVar113 + uVar62) * 0x80;
    auVar162._4_4_ = (iVar87 + uVar74) * 0x80;
    auVar162._8_4_ = (iVar111 + uVar75) * 0x80;
    auVar162._12_4_ = (iVar112 + uVar76) * 0x80;
    auVar31._0_4_ = iVar113 + uVar62 >> 0x19;
    auVar31._4_4_ = iVar87 + uVar74 >> 0x19;
    auVar31._8_4_ = iVar111 + uVar75 >> 0x19;
    auVar31._12_4_ = iVar112 + uVar76 >> 0x19;
    auVar31 = auVar31 ^ auVar162 ^ auVar138;
    uVar22 = auVar31._0_4_;
    uVar33 = auVar31._4_4_;
    uVar34 = auVar31._8_4_;
    uVar35 = auVar31._12_4_;
    auVar139._0_4_ = (uVar22 + uVar62) * 0x200;
    auVar139._4_4_ = (uVar33 + uVar74) * 0x200;
    auVar139._8_4_ = (uVar34 + uVar75) * 0x200;
    auVar139._12_4_ = (uVar35 + uVar76) * 0x200;
    auVar163._0_4_ = uVar22 + uVar62 >> 0x17;
    auVar163._4_4_ = uVar33 + uVar74 >> 0x17;
    auVar163._8_4_ = uVar34 + uVar75 >> 0x17;
    auVar163._12_4_ = uVar35 + uVar76 >> 0x17;
    auVar163 = auVar163 ^ auVar139 ^ auVar45;
    iVar11 = auVar163._0_4_;
    iVar21 = auVar163._4_4_;
    uVar60 = auVar163._8_4_ + uVar34;
    uVar145 = auVar163._12_4_ + uVar35;
    auVar46._0_4_ = iVar11 + uVar22 >> 0x13;
    auVar46._4_4_ = iVar21 + uVar33 >> 0x13;
    auVar46._8_4_ = uVar60 >> 0x13;
    auVar46._12_4_ = uVar145 >> 0x13;
    auVar140._0_4_ = (iVar11 + uVar22) * 0x2000;
    auVar140._4_4_ = (iVar21 + uVar33) * 0x2000;
    auVar140._8_4_ = uVar60 * 0x2000;
    auVar140._12_4_ = uVar145 * 0x2000;
    auVar141 = (auVar140 | auVar46) ^ auVar141;
    auVar110._0_12_ = auVar141._4_12_;
    auVar110._12_4_ = auVar141._0_4_;
    uVar60 = auVar141._0_4_ + iVar11;
    uVar145 = auVar141._4_4_ + iVar21;
    uVar61 = auVar141._8_4_ + auVar163._8_4_;
    uVar146 = auVar141._12_4_ + auVar163._12_4_;
    auVar164._0_8_ = auVar163._8_8_;
    auVar164._8_4_ = iVar11;
    auVar164._12_4_ = iVar21;
    uVar62 = (uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar62;
    uVar74 = (uVar145 * 0x40000 | uVar145 >> 0xe) ^ uVar74;
    uVar75 = (uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar75;
    uVar76 = (uVar146 * 0x40000 | uVar146 >> 0xe) ^ uVar76;
    auVar19._0_4_ = (uVar35 + uVar62) * 0x80;
    auVar19._4_4_ = (uVar22 + uVar74) * 0x80;
    auVar19._8_4_ = (uVar33 + uVar75) * 0x80;
    auVar19._12_4_ = (uVar34 + uVar76) * 0x80;
    auVar32._0_4_ = uVar35 + uVar62 >> 0x19;
    auVar32._4_4_ = uVar22 + uVar74 >> 0x19;
    auVar32._8_4_ = uVar33 + uVar75 >> 0x19;
    auVar32._12_4_ = uVar34 + uVar76 >> 0x19;
    auVar32 = auVar32 ^ auVar19 ^ auVar110;
    iVar112 = auVar32._0_4_;
    iVar113 = auVar32._4_4_;
    iVar166 = auVar32._8_4_;
    iVar168 = auVar32._12_4_;
    auVar20._0_4_ = (iVar112 + uVar62) * 0x200;
    auVar20._4_4_ = (iVar113 + uVar74) * 0x200;
    auVar20._8_4_ = (iVar166 + uVar75) * 0x200;
    auVar20._12_4_ = (iVar168 + uVar76) * 0x200;
    auVar170._0_4_ = iVar112 + uVar62 >> 0x17;
    auVar170._4_4_ = iVar113 + uVar74 >> 0x17;
    auVar170._8_4_ = iVar166 + uVar75 >> 0x17;
    auVar170._12_4_ = iVar168 + uVar76 >> 0x17;
    auVar170 = auVar170 ^ auVar20 ^ auVar164;
    iVar11 = auVar170._0_4_;
    iVar21 = auVar170._4_4_;
    iVar87 = auVar170._8_4_;
    iVar111 = auVar170._12_4_;
    uVar35 = ((iVar11 + iVar112) * 0x2000 | (uint)(iVar11 + iVar112) >> 0x13) ^ uVar35;
    uVar22 = ((iVar21 + iVar113) * 0x2000 | (uint)(iVar21 + iVar113) >> 0x13) ^ uVar22;
    uVar33 = ((iVar87 + iVar166) * 0x2000 | (uint)(iVar87 + iVar166) >> 0x13) ^ uVar33;
    uVar34 = ((iVar111 + iVar168) * 0x2000 | (uint)(iVar111 + iVar168) >> 0x13) ^ uVar34;
    uVar60 = uVar35 + iVar11;
    uVar145 = uVar22 + iVar21;
    uVar61 = uVar33 + iVar87;
    uVar146 = uVar34 + iVar111;
    uVar147 = ((uVar60 * 0x40000 | uVar60 >> 0xe) ^ uVar62) + uVar147;
    uVar165 = ((uVar145 * 0x40000 | uVar145 >> 0xe) ^ uVar74) + uVar165;
    uVar167 = ((uVar61 * 0x40000 | uVar61 >> 0xe) ^ uVar75) + uVar167;
    uVar169 = ((uVar146 * 0x40000 | uVar146 >> 0xe) ^ uVar76) + uVar169;
    puVar2 = (uint *)((long)Bout + lVar9 + r * 0x40 + -0x30);
    *puVar2 = uVar147;
    puVar2[1] = uVar165;
    puVar2[2] = uVar167;
    puVar2[3] = uVar169;
    uVar22 = uVar22 + uVar114;
    uVar33 = uVar33 + uVar142;
    uVar34 = uVar34 + uVar143;
    uVar35 = uVar35 + uVar144;
    puVar2 = (uint *)((long)Bout + lVar9 + r * 0x40 + -0x20);
    *puVar2 = uVar22;
    puVar2[1] = uVar33;
    puVar2[2] = uVar34;
    puVar2[3] = uVar35;
    auVar36._0_4_ = iVar87 + auVar47._0_4_;
    auVar36._4_4_ = iVar111 + auVar47._4_4_;
    auVar36._8_4_ = iVar11 + auVar47._8_4_;
    auVar36._12_4_ = iVar21 + auVar47._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9 + r * 0x40 + -0x10) = auVar36;
    auVar23._0_4_ = iVar168 + auVar59._0_4_;
    auVar23._4_4_ = iVar112 + auVar59._4_4_;
    auVar23._8_4_ = iVar113 + auVar59._8_4_;
    auVar23._12_4_ = iVar166 + auVar59._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9 + r * 0x40) = auVar23;
    lVar9 = lVar9 + 0x40;
  }
  return uVar147;
}

Assistant:

static uint32_t
blockmix_salsa8_xor(const salsa20_blk_t *restrict Bin1,
    const salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin2[r * 2 + 1], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin2[i * 2 + 1], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin2[r * 2], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	XOR4_2(Bin1[r * 2 + 1].q, Bin2[r * 2 + 1].q)

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2 + 1].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2 + 1].q, Bout[r + 1 + i].q)
	}

	return _mm_cvtsi128_si32(X0);
}